

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::executeAccessingBoundingBoxType
               (NegativeTestContext *ctx,string *builtInTypeName,GLSLVersion glslVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  bool bVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string extensionPrim;
  string version;
  string extensionTess;
  string local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream sourceStream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sourceStream);
  version._M_dataplus._M_p = (pointer)&version.field_2;
  version._M_string_length = 0;
  extensionPrim._M_dataplus._M_p = (pointer)&extensionPrim.field_2;
  extensionPrim._M_string_length = 0;
  extensionTess._M_dataplus._M_p = (pointer)&extensionTess.field_2;
  extensionTess._M_string_length = 0;
  version.field_2._M_local_buf[0] = '\0';
  extensionPrim.field_2._M_local_buf[0] = '\0';
  extensionTess.field_2._M_local_buf[0] = '\0';
  if (glslVersion == GLSL_VERSION_310_ES) {
    std::__cxx11::string::assign((char *)&version);
    std::__cxx11::string::assign((char *)&extensionPrim);
  }
  else {
    std::__cxx11::string::assign((char *)&version);
    std::__cxx11::string::assign((char *)&extensionPrim);
  }
  std::__cxx11::string::assign((char *)&extensionTess);
  std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
  std::operator+(&local_348,&local_368,"[]");
  std::operator+(&local_388,&local_348," in vertex shader");
  NegativeTestContext::beginSection(ctx,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  poVar4 = std::operator<<(&sourceStream.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&version);
  poVar4 = std::operator<<(poVar4,(string *)&extensionPrim);
  poVar4 = std::operator<<(poVar4,"void main()\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator+(&local_348,"\t",builtInTypeName);
  std::operator+(&local_388,&local_348,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
  poVar4 = std::operator<<(poVar4,(string *)&local_388);
  std::operator+(&local_328,"\tgl_Position = ",builtInTypeName);
  std::operator+(&local_368,&local_328,"[0];\n");
  poVar4 = std::operator<<(poVar4,(string *)&local_368);
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_348);
  puVar2 = &sourceStream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::stringbuf::str();
  verifyShader(ctx,SHADERTYPE_VERTEX,&local_1c8,EXPECT_RESULT_FAIL);
  std::__cxx11::string::~string((string *)&local_1c8);
  NegativeTestContext::endSection(ctx);
  paVar1 = &local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_388._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)puVar2);
  std::__cxx11::string::~string((string *)&local_388);
  bVar3 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_EVALUATION);
  if (bVar3) {
    std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
    std::operator+(&local_348,&local_368,"[]");
    std::operator+(&local_388,&local_348," in tessellation evaluation shader");
    NegativeTestContext::beginSection(ctx,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    poVar4 = std::operator<<(&sourceStream.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&version);
    poVar4 = std::operator<<(poVar4,(string *)&extensionPrim);
    poVar4 = std::operator<<(poVar4,(string *)&extensionTess);
    poVar4 = std::operator<<(poVar4,"layout (triangles, equal_spacing, ccw) in;\n");
    poVar4 = std::operator<<(poVar4,"void main()\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    std::operator+(&local_348,"\t",builtInTypeName);
    std::operator+(&local_388,&local_348,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,(string *)&local_388);
    std::operator+(&local_328,"\tgl_Position = (\tgl_TessCoord.x * ",builtInTypeName);
    std::operator+(&local_368,&local_328,"[0] +\n");
    poVar4 = std::operator<<(poVar4,(string *)&local_368);
    std::operator+(&local_208,"\t\t\t\t\tgl_TessCoord.y * ",builtInTypeName);
    std::operator+(&local_1e8,&local_208,"[0] +\n");
    poVar4 = std::operator<<(poVar4,(string *)&local_1e8);
    std::operator+(&local_248,"\t\t\t\t\tgl_TessCoord.z * ",builtInTypeName);
    std::operator+(&local_228,&local_248,"[0]);\n");
    poVar4 = std::operator<<(poVar4,(string *)&local_228);
    std::operator<<(poVar4,"}\n");
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_TESSELLATION_EVALUATION,&local_268,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_268);
    NegativeTestContext::endSection(ctx);
    local_388._M_string_length = 0;
    local_388.field_2._M_local_buf[0] = '\0';
    local_388._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str((string *)puVar2);
    std::__cxx11::string::~string((string *)&local_388);
  }
  bVar3 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_GEOMETRY);
  if (bVar3) {
    std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
    std::operator+(&local_348,&local_368,"[]");
    std::operator+(&local_388,&local_348," in geometry shader");
    NegativeTestContext::beginSection(ctx,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    poVar4 = std::operator<<(&sourceStream.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)&version);
    poVar4 = std::operator<<(poVar4,(string *)&extensionPrim);
    poVar4 = std::operator<<(poVar4,"layout (triangles) in;\n");
    poVar4 = std::operator<<(poVar4,"layout (triangle_strip, max_vertices = 3) out;\n");
    poVar4 = std::operator<<(poVar4,"void main()\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    std::operator+(&local_348,"\t",builtInTypeName);
    std::operator+(&local_388,&local_348,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,(string *)&local_388);
    poVar4 = std::operator<<(poVar4,"\tfor (int idx = 0; idx < 3; idx++)\n");
    poVar4 = std::operator<<(poVar4,"\t{\n");
    std::operator+(&local_328,"\t\tgl_Position = gl_in[idx].gl_Position * ",builtInTypeName);
    std::operator+(&local_368,&local_328,"[0];\n");
    poVar4 = std::operator<<(poVar4,(string *)&local_368);
    poVar4 = std::operator<<(poVar4,"\t\tEmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\t}\n");
    poVar4 = std::operator<<(poVar4,"\tEndPrimitive();\n");
    std::operator<<(poVar4,"}\n");
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_GEOMETRY,&local_288,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_288);
    NegativeTestContext::endSection(ctx);
    local_388._M_string_length = 0;
    local_388.field_2._M_local_buf[0] = '\0';
    local_388._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str((string *)puVar2);
    std::__cxx11::string::~string((string *)&local_388);
  }
  std::operator+(&local_368,"cannot access built-in type ",builtInTypeName);
  std::operator+(&local_348,&local_368,"[]");
  std::operator+(&local_388,&local_348," in fragment shader");
  NegativeTestContext::beginSection(ctx,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  poVar4 = std::operator<<(&sourceStream.super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&version);
  poVar4 = std::operator<<(poVar4,(string *)&extensionPrim);
  poVar4 = std::operator<<(poVar4,"layout (location = 0) out mediump vec4 fs_colour;\n");
  poVar4 = std::operator<<(poVar4,"void main()\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator+(&local_348,"\t",builtInTypeName);
  std::operator+(&local_388,&local_348,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
  poVar4 = std::operator<<(poVar4,(string *)&local_388);
  std::operator+(&local_328,"\tfs_colour = ",builtInTypeName);
  std::operator+(&local_368,&local_328,"[0];\n");
  poVar4 = std::operator<<(poVar4,(string *)&local_368);
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::stringbuf::str();
  verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_2a8,EXPECT_RESULT_FAIL);
  std::__cxx11::string::~string((string *)&local_2a8);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::~string((string *)&extensionTess);
  std::__cxx11::string::~string((string *)&extensionPrim);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sourceStream);
  return;
}

Assistant:

void executeAccessingBoundingBoxType (NegativeTestContext& ctx, const std::string builtInTypeName, glu::GLSLVersion glslVersion)
{
	std::ostringstream	sourceStream;
	std::string			version;
	std::string			extensionPrim;
	std::string			extensionTess;

	if (glslVersion == glu::GLSL_VERSION_310_ES)
	{
		version = "#version 310 es\n";
		extensionPrim = "#extension GL_EXT_primitive_bounding_box : require\n";
		extensionTess = "#extension GL_EXT_tessellation_shader : require\n";
	}
	else if (glslVersion >= glu::GLSL_VERSION_320_ES)
	{
		version = "#version 320 es\n";
		extensionPrim = "";
		extensionTess = "";
	}
	else
	{
		DE_FATAL("error: context below 3.1 and not supported");
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in vertex shader");
	sourceStream	<< version
					<< extensionPrim
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	gl_Position = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_VERTEX, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();

	sourceStream.str(std::string());

	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in tessellation evaluation shader");
		sourceStream	<< version
						<< extensionPrim
						<< extensionTess
						<< "layout (triangles, equal_spacing, ccw) in;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	gl_Position = (	gl_TessCoord.x * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.y * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.z * " +  builtInTypeName + "[0]);\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_TESSELLATION_EVALUATION, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in geometry shader");
		sourceStream	<< version
						<< extensionPrim
						<< "layout (triangles) in;\n"
						<< "layout (triangle_strip, max_vertices = 3) out;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	for (int idx = 0; idx < 3; idx++)\n"
						<< "	{\n"
						<< "		gl_Position = gl_in[idx].gl_Position * " + builtInTypeName + "[0];\n"
						<< "		EmitVertex();\n"
						<< "	}\n"
						<< "	EndPrimitive();\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_GEOMETRY, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in fragment shader");
	sourceStream	<< version
					<< extensionPrim
					<< "layout (location = 0) out mediump vec4 fs_colour;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	fs_colour = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();
}